

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

int __thiscall TadsHttpServerThread::process_request(TadsHttpServerThread *this)

{
  OS_Counter *pOVar1;
  bool bVar2;
  TadsHttpRequestHeader *pTVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  StringRef *this_00;
  ulong uVar7;
  char *pcVar8;
  char *s1;
  void *pvVar9;
  long lVar10;
  TadsHttpRequest *this_01;
  ssize_t sVar11;
  char *pcVar12;
  size_t __n;
  StringRef *pSVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  StringRef *this_02;
  TadsHttpRequestHeader *hdr_list;
  TadsHttpRequestHeader *hdr_tail;
  ulong local_60;
  size_t res_name_len;
  char *resource_name;
  size_t verb_len;
  char *verb;
  char *p;
  
  this_00 = (StringRef *)operator_new(0x28);
  StringRef::StringRef(this_00,0x400);
  hdr_list = (TadsHttpRequestHeader *)0x0;
  hdr_tail = (TadsHttpRequestHeader *)0x0;
  iVar6 = 0;
  uVar5 = read_to_nl(this,this_00,0,0,4);
  if ((int)uVar5 < 0) goto LAB_0020ac94;
  uVar7 = (ulong)uVar5;
  pcVar12 = this_00->str;
  local_60 = this_00->len;
  lVar14 = uVar7 - 2;
  p = pcVar12;
  if (lVar14 < (long)local_60) {
    this_00->len = lVar14;
    pcVar12[lVar14] = '\0';
    p = this_00->str;
  }
  parse_tok(&p,&verb,&verb_len);
  parse_tok(&p,&resource_name,&res_name_len);
  iVar6 = 0;
  TadsHttpRequestHeader::parse_headers(&hdr_list,&hdr_tail,0,this_00,0);
  pcVar8 = TadsHttpRequestHeader::find(hdr_list,"content-length");
  s1 = TadsHttpRequestHeader::find(hdr_list,"transfer-encoding");
  uVar4 = local_60;
  this_02 = (StringRef *)0x0;
  if (pcVar8 == (char *)0x0 && s1 == (char *)0x0) {
LAB_0020abc3:
    this_01 = (TadsHttpRequest *)operator_new(0x70);
    pSVar13 = this_00;
    TadsHttpRequest::TadsHttpRequest
              (this_01,this,verb,verb_len,this_00,hdr_list,this_02,iVar6,resource_name,res_name_len,
               ((this->super_TadsServerThread).listener)->shutdown_evt);
    hdr_list = (TadsHttpRequestHeader *)0x0;
    sVar11 = TadsMessageQueue::send
                       (this->queue,(int)this_01,(void *)0xffffffffffffffff,verb_len,(int)pSVar13);
    if ((int)sVar11 == 0) {
      iVar6 = TadsMessageQueue::is_quitting(this->queue);
      if (iVar6 == 0) {
        pcVar8 = "500 Internal Server Error";
        pcVar12 = 
        "<html><title>500 Internal Server Error</title><body><h1>Internal Server Error</h1></body></html>"
        ;
      }
      else {
        pcVar8 = "503 Service Unavailable (Shutting Down)";
        pcVar12 = 
        "<html><title>503 Service Unavailable</title><body><h1>Service Unavailable</h1>The server is shutting down and cannot process any more requests.</body></html>"
        ;
      }
      send_simple(this,pcVar8,"text/html",pcVar12);
    }
    LOCK();
    pOVar1 = &(this_01->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(this_01->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj[1]
      )(this_01);
    }
    iVar6 = 1;
    if (this_02 == (StringRef *)0x0) goto LAB_0020ac94;
  }
  else {
    pvVar15 = (void *)(local_60 - uVar7);
    if (pcVar8 != (char *)0x0) {
      pvVar9 = (void *)atol(pcVar8);
      if (pvVar9 == (void *)0x0) {
        this_02 = (StringRef *)0x0;
      }
      else {
        if (this->upload_limit < (long)pvVar9 && this->upload_limit != 0) {
          this_02 = (StringRef *)0x0;
          TadsServerThread::read(&this->super_TadsServerThread,0,(void *)0x0,(size_t)pvVar9);
          iVar6 = 1;
          goto LAB_0020abc3;
        }
        this_02 = (StringRef *)operator_new(0x28);
        StringRef::StringRef(this_02,(long)pvVar9);
        if (uVar4 == uVar7) {
LAB_0020a8cf:
          sVar11 = TadsServerThread::read
                             (&this->super_TadsServerThread,(int)this_02->str + (int)this_02->len,
                              pvVar9,(size_t)pvVar9);
          if (sVar11 < 0) {
            pcVar12 = "Error receiving request message body";
            goto LAB_0020acf6;
          }
        }
        else {
          if ((long)pvVar9 <= (long)pvVar15) {
            pvVar15 = pvVar9;
          }
          StringRef::append(this_02,pcVar12 + uVar7,(long)pvVar15);
          pvVar9 = (void *)((long)pvVar9 - (long)pvVar15);
          if (pvVar9 != (void *)0x0) goto LAB_0020a8cf;
          pvVar9 = (void *)0x0;
        }
        this_02->len = this_02->len + (long)pvVar9;
      }
      iVar6 = 0;
      goto LAB_0020abc3;
    }
    iVar6 = stricmp(s1,"chunked");
    if (iVar6 != 0) {
      send_simple(this,"400 Bad Request","text/html",
                  "<html><title>Bad Request</title><h1>Bad Request</h1>This server does not accept the specified transfer-encoding."
                 );
      iVar6 = 0;
      goto LAB_0020ac94;
    }
    this_02 = (StringRef *)operator_new(0x28);
    pvVar9 = (void *)0x7d00;
    if (32000 < (long)pvVar15) {
      pvVar9 = pvVar15;
    }
    StringRef::StringRef(this_02,(long)pvVar9);
    if (uVar4 != uVar7) {
      StringRef::append(this_02,pcVar12 + uVar7,(long)pvVar15);
    }
    bVar2 = false;
    lVar14 = 0;
LAB_0020a949:
    do {
      iVar6 = read_to_nl(this,this_02,lVar14,0,2);
      if (iVar6 < 0) goto LAB_0020ad0c;
      lVar16 = (long)iVar6;
      lVar10 = strtol(this_02->str + lVar14,(char **)0x0,0x10);
      lVar17 = this_02->len;
      __n = lVar17 - lVar16;
      if (__n != 0 && lVar16 <= lVar17) {
        memmove(this_02->str + lVar14,this_02->str + lVar16,__n);
        lVar17 = this_02->len;
      }
      lVar16 = __n + lVar14;
      if (lVar16 < lVar17) {
        this_02->len = lVar16;
        this_02->str[lVar16] = '\0';
      }
      if (lVar10 == 0) {
        uVar5 = read_to_nl(this,this_02,lVar14,2,4);
        if ((int)uVar5 < 0) goto LAB_0020ad0c;
        if (lVar14 + 2 < (long)(ulong)uVar5) {
          TadsHttpRequestHeader::parse_headers(&hdr_list,&hdr_tail,1,this_02,lVar14);
        }
        if (lVar14 < this_02->len) {
          this_02->len = lVar14;
          this_02->str[lVar14] = '\0';
        }
        if (bVar2) {
          LOCK();
          pOVar1 = &(this_02->super_CVmRefCntObj).cnt;
          (pOVar1->cnt).super___atomic_base<long>._M_i =
               (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          iVar6 = 1;
          if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
            (*(this_02->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_02);
          }
          this_02 = (StringRef *)0x0;
        }
        else {
          iVar6 = 0;
        }
        goto LAB_0020abc3;
      }
      if ((this->upload_limit != 0) && (!bVar2)) {
        bVar2 = this->upload_limit < this_02->len + lVar10;
      }
      lVar17 = lVar10 - __n;
      if (-2 < lVar17) {
        pvVar15 = (void *)(lVar17 + 2);
        if (bVar2) {
          sVar11 = TadsServerThread::read
                             (&this->super_TadsServerThread,0,(void *)0x0,(size_t)pvVar15);
          if (sVar11 < 0) goto LAB_0020ad0c;
          lVar14 = 0;
          if (this_02->len < 1) goto LAB_0020a949;
          this_02->len = 0;
          pcVar12 = this_02->str;
          lVar14 = 0;
        }
        else {
          StringRef::ensure(this_02,(long)pvVar15);
          sVar11 = TadsServerThread::read
                             (&this->super_TadsServerThread,(int)this_02->str + (int)this_02->len,
                              pvVar15,(size_t)pvVar15);
          if (sVar11 < 0) break;
          lVar14 = this_02->len;
          lVar10 = (long)pvVar15 + lVar14;
          this_02->len = lVar10;
          if (*(short *)(this_02->str + lVar10 + -2) != 0xa0d) {
            pcVar12 = "Error in request message chunk";
            goto LAB_0020acf6;
          }
          lVar14 = lVar14 + lVar17;
          this_02->len = lVar14;
          pcVar12 = this_02->str + lVar14;
          bVar2 = false;
        }
LAB_0020ab36:
        *pcVar12 = '\0';
        goto LAB_0020a949;
      }
      lVar14 = lVar14 + lVar10;
      lVar10 = __n - lVar10;
      if (1 < lVar10) {
        if (lVar10 != 2) {
          memmove(this_02->str + lVar14,this_02->str + lVar14 + 2,lVar10 - 2);
          lVar17 = this_02->len + -2;
          this_02->len = lVar17;
          pcVar12 = this_02->str + lVar17;
          goto LAB_0020ab36;
        }
        goto LAB_0020a949;
      }
      pvVar15 = (void *)(2 - lVar10);
      StringRef::ensure(this_02,(long)pvVar15);
      sVar11 = TadsServerThread::read
                         (&this->super_TadsServerThread,(int)this_02->str + (int)this_02->len,
                          pvVar15,(size_t)pvVar15);
    } while (-1 < sVar11);
    pcVar12 = "Error receiving request message chunk";
LAB_0020acf6:
    send_simple(this,"400 Bad Request","text/html",pcVar12);
LAB_0020ad0c:
    iVar6 = 0;
  }
  LOCK();
  pOVar1 = &(this_02->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(this_02->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_02);
  }
LAB_0020ac94:
  LOCK();
  pOVar1 = &(this_00->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(this_00->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_00);
  }
  pTVar3 = hdr_list;
  if (hdr_list != (TadsHttpRequestHeader *)0x0) {
    TadsHttpRequestHeader::~TadsHttpRequestHeader(hdr_list);
    operator_delete(pTVar3,0x18);
  }
  return iVar6;
}

Assistant:

int TadsHttpServerThread::process_request()
{
    StringRef *hdrs = new StringRef(1024);
    TadsHttpRequestHeader *hdr_list = 0, *hdr_tail = 0;
    TadsHttpRequest *req = 0;
    char *verb;
    size_t verb_len;
    char *resource_name;
    size_t res_name_len;
    int ok = FALSE;
    long ofs;
    char *p, *hbody;
    StringRef *body = 0;
    int overflow = FALSE;
    long hbodylen;
    const char *hcl, *hte;             /* content-length, transfer-encoding */

    /* 
     *   Read the header.  We read data into our buffer until we find a
     *   double CR-LF sequence, indicating the end of the header.  
     */
    if ((ofs = read_to_nl(hdrs, 0, 0, 4)) < 0)
        goto done;

    /* the body, if any, starts after the double line break */
    hbody = hdrs->get() + ofs;
    hbodylen = hdrs->getlen() - ofs;

    /* truncate the headers to the CR-LF-CR-LF sequence */
    hdrs->truncate(ofs - 2);

    /*
     *   Parse the main verb in the header - get the method and the resource
     *   ID.  The format is:
     *   
     *.     <space>* VERB <space>+ RESOURCE <space>+ HTTP-VERSION <CRLF>
     */
    p = hdrs->get();
    parse_tok(p, verb, verb_len);
    parse_tok(p, resource_name, res_name_len);

    /* now parse the remaining headers */
    TadsHttpRequestHeader::parse_headers(hdr_list, hdr_tail, FALSE, hdrs, 0);

    /* 
     *   Check to see if there's a message body.  There is if there's a
     *   content-length or transfer-encoding header.
     */
    hcl = hdr_list->find("content-length");
    hte = hdr_list->find("transfer-encoding");
    if (hcl != 0 || hte != 0)
    {
        /* 
         *   There's a content body.  If there's a content-length field,
         *   pre-allocate a chunk of memory, then read the number of bytes
         *   indicated.  If it's a chunked transfer, read it in pieces.  
         */
        if (hcl != 0)
        {
            /* get the length */
            long hclval = atol(hcl);

            /* if it's non-zero, read the content */
            if (hclval != 0)
            {
                /* if this exceeds the size limit, abort */
                if (upload_limit != 0 && hclval > upload_limit)
                {
                    /* set the overflow flag, discard the input, and abort */
                    overflow = TRUE;
                    read(0, 0, hclval, 5000);
                    goto done_with_upload;
                }

                /* allocate the buffer; it's initially empty */
                body = new StringRef(hclval);

                /* copy any portion of the body we've already read */
                if (hbodylen != 0)
                {
                    /* limit this to the declared size */
                    if (hbodylen > hclval)
                        hbodylen = hclval;

                    /* copy the data */
                    body->append(hbody, hbodylen);

                    /* deduct the remaining size */
                    hclval -= hbodylen;
                }

                /* read the body */
                if (hclval != 0
                    && read(body->getend(), hclval, hclval, 5000) < 0)
                {
                    send_simple(S_http_400, "text/html",
                                "Error receiving request message body");
                    goto done;
                }

                /* set the body length */
                body->addlen(hclval);
            }
        }
        else if (stricmp(hte, "chunked") == 0)
        {
            /* set up a string buffer for the content */
            const long initlen = 32000;
            body = new StringRef(hbodylen > initlen ? hbodylen : initlen);

            /* if we've already read some body text, copy it to the buffer */
            if (hbodylen != 0)
                body->append(hbody, hbodylen);
            
            /* keep going until we reach the end marker */
            for (ofs = 0 ; ; )
            {
                /* read to the first newline */
                long nlofs = read_to_nl(body, ofs, 0, 2);
                if (nlofs < 0)
                    goto done;

                /* get the chunk length */
                long chunklen = strtol(body->get() + ofs, 0, 16);

                /* 
                 *   We're done with the chunk length.  Move any read-ahead
                 *   content down in memory so that it directly abuts the
                 *   preceding chunk, so that when we're done we'll have the
                 *   content assembled into one contiguous piece.  
                 */
                long ralen = body->getlen() - nlofs;
                if (ralen > 0)
                    memmove(body->get() + ofs, body->get() + nlofs,
                            body->getlen() - nlofs);

                /* stop at the end of the read-ahead portion */
                body->truncate(ofs + ralen);

                /* if the chunk length is zero, we're done */
                if (chunklen == 0)
                    break;

                /* check if this would overflow our upload size limit */
                if (upload_limit != 0
                    && !overflow
                    && body->getlen() + chunklen > upload_limit)
                {
                    /* flag the overflow, but keep reading the content */
                    overflow = TRUE;
                }

                /* 
                 *   figure the remaining read size for this chunk, after any
                 *   read-ahead portion 
                 */
                long chunkrem = chunklen - ralen;

                /* 
                 *   if we've already overflowed, read and discard the chunk;
                 *   otherwise read it into our buffer 
                 */
                if (chunkrem + 2 <= 0)
                {
                    /* 
                     *   We've already read ahead by enough to cover the next
                     *   chunk and the newline at the end.  Go in and delete
                     *   the newline (or as much of it as exists).  Start by
                     *   getting the offset of the newline: it's just after
                     *   the current chunk, which starts at 'ofs' and runs
                     *   for 'chunklen'.  
                     */
                    nlofs = ofs + chunklen;

                    /* 
                     *   if we haven't yet read the full newline sequence, do
                     *   so now
                     */
                    if (ralen - chunklen < 2)
                    {
                        long nllen = 2 - (ralen - chunklen);
                        body->ensure(nllen);
                        if (read(body->getend(), nllen, nllen, 30000) < 0)
                        {
                            send_simple(S_http_400, "text/html",
                                        "Error receiving request message chunk");
                            goto done;
                        }
                    }

                    /* 
                     *   if there's anything after the newline, move it down
                     *   to overwrite the newline 
                     */
                    if (ralen - chunklen > 2)
                    {
                        /* move the bytes */
                        memmove(body->get() + nlofs,
                                body->get() + nlofs + 2,
                                ralen - chunklen - 2);

                        /* adjust the size for the closed gap */
                        body->truncate(body->getlen() - 2);
                    }

                    /* resume from after the newline */
                    ofs = nlofs;
                }
                else if (overflow)
                {
                    /* overflow - discard the chunk size (plus the CR-LF) */
                    if (read(0, 0, chunkrem+2, 30000) < 0)
                        goto done;

                    /* clear the buffer */
                    body->truncate(0);
                    ofs = 0;
                }
                else
                {
                    /* ensure the buffer is big enough */
                    body->ensure(chunkrem + 2);

                    /* read the chunk, plus the CR-LF that follows */
                    if (read(body->getend(),
                             chunkrem + 2, chunkrem + 2, 30000) < 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error receiving request message chunk");
                        goto done;
                    }

                    /* count the amount we just read in the buffer length */
                    body->addlen(chunkrem + 2);

                    /* verify that the last two bytes are indeed CR-LF */
                    if (memcmp(body->getend() - 2, "\r\n", 2) != 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error in request message chunk");
                        goto done;
                    }

                    /* 
                     *   move past the chunk for the next read, minus the
                     *   CR-LF that follows the chunk - that isn't part of
                     *   the data, but just part of the protocol 
                     */
                    ofs = body->getlen() - 2;
                    body->truncate(ofs);
                }
            }

            /* 
             *   Read to the closing blank line.  We've just passed one
             *   newline, following the '0' end length marker, so we're in
             *   state 2.  We could have either another newline following, or
             *   "trailers" (more headers, following the content body).
             */
            long nlofs = read_to_nl(body, ofs, 2, 4);
            if (nlofs < 0)
                goto done;

            /* 
             *   if we have more than just the closing blank line, we have
             *   trailers - append them to the headers 
             */
            if (nlofs > ofs + 2)
            {
                TadsHttpRequestHeader::parse_headers(
                    hdr_list, hdr_tail, TRUE, body, ofs);
            }

            /* 
             *   the trailers (if any) and closing newline aren't part of the
             *   content - clip them out of the body 
             */
            body->truncate(ofs);
        }
        else
        {
            /* 
             *   Other combinations of these headers are illegal.  Send an
             *   error and abort. 
             */
            send_simple(S_http_400, "text/html",
                        "<html><title>Bad Request</title>"
                        "<h1>Bad Request</h1>"
                        "This server does not accept the specified "
                        "transfer-encoding.");
            goto done;
        }

    done_with_upload:
        /* done with the upload - check for overflow */
        if (overflow)
        {
            /* release the body, if present */
            if (body != 0)
            {
                body->release_ref();
                body = 0;
            }
        }
    }

    /* create a message object for the request */
    req = new TadsHttpRequest(
        this, verb, verb_len, hdrs, hdr_list, body, overflow,
        resource_name, res_name_len,
        listener->get_shutdown_evt());

    /* we've handed over the header list to the request */
    hdr_list = 0;
    
    /* send it to the main thread, and wait for the reply */
    if (queue->send(req, OS_FOREVER))
    {
        /* 
         *   success - the server will already have sent the reply, so we're
         *   done 
         */
    }
    else if (queue->is_quitting())
    {
        /* failed due to server shutdown */
        send_simple(S_http_503, "text/html", S_http_503_quitting_body);
    }
    else
    {
        /* 'send' failed - return an internal server error */
        send_simple(S_http_500, "text/html", S_http_500_body);
    }
    
    /* we're done with the request */
    req->release_ref();

    /* success */
    ok = TRUE;

done:
    /* release the message body buffer */
    if (body != 0)
        body->release_ref();

    /* release the header buffer */
    hdrs->release_ref();

    /* delete the header list */
    if (hdr_list != 0)
        delete hdr_list;

    /* return the success/failure indication */
    return ok;
}